

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_session.hpp
# Opt level: O2

SessionWriter * binlog::default_thread_local_writer(void)

{
  Session *session;
  long *in_FS_OFFSET;
  string local_30;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    session = default_session();
    detail::this_thread_id_string_abi_cxx11_();
    SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),session,0x100000,0,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    __cxa_thread_atexit(SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  return (SessionWriter *)(*in_FS_OFFSET + -0x38);
}

Assistant:

inline SessionWriter& default_thread_local_writer()
{
  static thread_local SessionWriter s_writer(
    default_session(),
    1 << 20, // queue capacity
    0,       // writer id
    detail::this_thread_id_string() // writer name
  );
  return s_writer;
}